

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

BooleanColumnReader * __thiscall
duckdb::ColumnReader::Cast<duckdb::BooleanColumnReader>(ColumnReader *this)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->column_schema->field_0x29 == '\x01') {
    return (BooleanColumnReader *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Failed to cast column reader to type - type mismatch","");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const LogicalType &Type() const {
		return column_schema.type;
	}